

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::TimeUnitsDeclarationSyntax::setChild
          (TimeUnitsDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0048fdc4 + *(int *)(&DAT_0048fdc4 + index * 4)))();
  return;
}

Assistant:

void TimeUnitsDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: time = child.token(); return;
        case 3: divider = child.node() ? &child.node()->as<DividerClauseSyntax>() : nullptr; return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}